

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O0

err_t cmdPwdRead(cmd_pwd_t *pwd,char *cmdline)

{
  bool_t bVar1;
  cmd_pwd_t *in_RSI;
  char *in_stack_00000010;
  cmd_pwd_t *in_stack_00000018;
  cmd_pwd_t *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  err_t local_4;
  
  bVar1 = strStartsWith((char *)in_RSI,"pass:");
  if (bVar1 == 0) {
    bVar1 = strStartsWith((char *)in_RSI,"env:");
    if (bVar1 == 0) {
      bVar1 = strStartsWith((char *)in_RSI,"share:");
      if (bVar1 == 0) {
        local_4 = 0x25b;
      }
      else {
        strLen((char *)0x107542);
        local_4 = cmdPwdReadShare(in_stack_00000018,in_stack_00000010);
      }
    }
    else {
      strLen((char *)0x1074f5);
      local_4 = cmdPwdReadEnv(in_RSI,in_stack_ffffffffffffffc0);
    }
  }
  else {
    strLen((char *)0x1074a4);
    local_4 = cmdPwdReadPass(in_stack_ffffffffffffffb8,(char *)0x1074b6);
  }
  return local_4;
}

Assistant:

err_t cmdPwdRead(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdReadPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdReadEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdReadShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}